

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSurfaceNurbs.cpp
# Opt level: O2

void __thiscall
chrono::geometry::ChSurfaceNurbs::ChSurfaceNurbs(ChSurfaceNurbs *this,ChSurfaceNurbs *source)

{
  int iVar1;
  
  ChSurface::ChSurface(&this->super_ChSurface,&source->super_ChSurface);
  (this->super_ChSurface).super_ChGeometry._vptr_ChGeometry =
       (_func_int **)&PTR__ChSurfaceNurbs_0118b730;
  (this->points).super_PlainObjectBase<Eigen::Matrix<chrono::ChVector<double>,__1,__1,_1,__1,__1>_>.
  m_storage.m_data = (ChVector<double> *)0x0;
  (this->points).super_PlainObjectBase<Eigen::Matrix<chrono::ChVector<double>,__1,__1,_1,__1,__1>_>.
  m_storage.m_rows = 0;
  (this->points).super_PlainObjectBase<Eigen::Matrix<chrono::ChVector<double>,__1,__1,_1,__1,__1>_>.
  m_storage.m_cols = 0;
  (this->weights).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_data
       = (double *)0x0;
  (this->weights).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_rows
       = 0;
  (this->weights).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_cols
       = 0;
  (this->knots_u).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  (this->knots_u).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
       0;
  (this->points).super_PlainObjectBase<Eigen::Matrix<chrono::ChVector<double>,__1,__1,_1,__1,__1>_>.
  m_storage.m_cols = 0;
  (this->weights).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_data
       = (double *)0x0;
  (this->weights).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_rows
       = 0;
  (this->weights).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_cols
       = 0;
  (this->knots_u).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  (this->knots_u).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
       0;
  (this->knots_v).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  (this->knots_v).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
       0;
  Eigen::internal::
  call_assignment<Eigen::Matrix<chrono::ChVector<double>,_1,_1,1,_1,_1>,Eigen::Matrix<chrono::ChVector<double>,_1,_1,1,_1,_1>>
            (&this->points,&source->points);
  iVar1 = source->p_v;
  this->p_u = source->p_u;
  this->p_v = iVar1;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Matrix<double,_1,1,0,_1,1>>
            (&this->knots_u,&source->knots_u);
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Matrix<double,_1,1,0,_1,1>>
            (&this->knots_v,&source->knots_v);
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,_1,1,_1,_1>,Eigen::Matrix<double,_1,_1,1,_1,_1>>
            (&this->weights,&source->weights);
  return;
}

Assistant:

ChSurfaceNurbs::ChSurfaceNurbs(const ChSurfaceNurbs& source) : ChSurface(source) {
    this->points = source.points;
    this->p_u = source.p_u;
    this->p_v = source.p_v;
    this->knots_u = source.knots_u;
    this->knots_v = source.knots_v;
    this->weights = source.weights;
}